

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser.cxx
# Opt level: O0

void __thiscall Fl_File_Chooser::ok_label(Fl_File_Chooser *this,char *l)

{
  Fl_Return_Button *pFVar1;
  int iVar2;
  uint uVar3;
  Fl_Group *this_00;
  uint uVar4;
  int local_20;
  int local_1c;
  int h;
  int w;
  char *l_local;
  Fl_File_Chooser *this_local;
  
  _h = l;
  l_local = (char *)this;
  if (l != (char *)0x0) {
    Fl_Widget::label((Fl_Widget *)this->okButton,l);
  }
  local_1c = 0;
  local_20 = 0;
  Fl_Widget::measure_label((Fl_Widget *)this->okButton,&local_1c,&local_20);
  pFVar1 = this->okButton;
  iVar2 = Fl_Widget::x(&this->cancelButton->super_Fl_Widget);
  uVar4 = (iVar2 + -0x32) - local_1c;
  uVar3 = Fl_Widget::y(&this->cancelButton->super_Fl_Widget);
  (*(pFVar1->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget[4])
            (pFVar1,(ulong)uVar4,(ulong)uVar3,(ulong)(local_1c + 0x28),0x19);
  this_00 = Fl_Widget::parent((Fl_Widget *)this->okButton);
  Fl_Group::init_sizes(this_00);
  return;
}

Assistant:

void Fl_File_Chooser::ok_label(const char *l) {
  if (l) okButton->label(l);
  int w=0, h=0;
  okButton->measure_label(w, h);
  okButton->resize(cancelButton->x() - 50 - w, cancelButton->y(),
                   w + 40, 25);
  okButton->parent()->init_sizes();
}